

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_support.c
# Opt level: O2

void test_filter_or_format(undefined1 *enable)

{
  int iVar1;
  archive *a;
  char *pcVar2;
  longlong v1;
  wchar_t line;
  
  a = archive_read_new();
  iVar1 = (*(code *)enable)(a);
  if (iVar1 == -0x14) {
    pcVar2 = archive_error_string(a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_support.c"
                     ,L'6',(uint)(pcVar2 != (char *)0x0),"NULL != archive_error_string(a)",
                     (void *)0x0);
    iVar1 = archive_errno(a);
    pcVar2 = "-1";
    line = L'7';
    v1 = -1;
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_support.c"
                        ,L'9',0,"ARCHIVE_OK",(long)iVar1,"result",a);
    pcVar2 = archive_error_string(a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_support.c"
                     ,L':',(uint)(pcVar2 == (char *)0x0),"NULL == archive_error_string(a)",
                     (void *)0x0);
    iVar1 = archive_errno(a);
    pcVar2 = "0";
    line = L';';
    v1 = 0;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,line,v1,pcVar2,(long)iVar1,"archive_errno(a)",a);
  archive_read_free(a);
  test_failure(archive_write_new,enable,archive_write_free);
  test_failure(archive_read_disk_new,enable,archive_read_free);
  test_failure(archive_write_disk_new,enable,archive_write_free);
  return;
}

Assistant:

static void
test_filter_or_format(enabler enable)
{
	test_success(archive_read_new, enable, archive_read_free);
	test_failure(archive_write_new, enable, archive_write_free);
	test_failure(archive_read_disk_new, enable, archive_read_free);
	test_failure(archive_write_disk_new, enable, archive_write_free);
}